

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O2

vector<despot::State_*,_std::allocator<despot::State_*>_> * __thiscall
despot::ParticleBelief::Sample
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,
          ParticleBelief *this,int num)

{
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> _Stack_38;
  
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&_Stack_38,
             &this->particles_);
  Sample(__return_storage_ptr__,num,
         (vector<despot::State_*,_std::allocator<despot::State_*>_> *)&_Stack_38,
         (this->super_Belief).model_);
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&_Stack_38);
  return __return_storage_ptr__;
}

Assistant:

vector<State*> ParticleBelief::Sample(int num) const {
	return Sample(num, particles_, model_);
}